

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

void get_system_identitier(char *system_id,size_t size)

{
  undefined1 local_19e [8];
  utsname u;
  size_t size_local;
  char *system_id_local;
  
  u.domainname._57_8_ = size;
  uname((utsname *)local_19e);
  strncpy(system_id,local_19e,u.domainname._57_8_ - 1);
  system_id[u.domainname._57_8_ + -1] = '\0';
  return;
}

Assistant:

static void
get_system_identitier(char *system_id, size_t size)
{
#if defined(HAVE_SYS_UTSNAME_H)
	struct utsname u;

	uname(&u);
	strncpy(system_id, u.sysname, size-1);
	system_id[size-1] = '\0';
#elif defined(_WIN32) && !defined(__CYGWIN__)
	strncpy(system_id, "Windows", size-1);
	system_id[size-1] = '\0';
#else
#error no way to get the system identifier on your platform.
#endif
}